

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  undefined1 local_68 [8];
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  CompactReporter *this_local;
  
  printer._55_1_ = 1;
  uVar2 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[5])();
  if (((uVar2 & 1) == 0) &&
     (bVar1 = AssertionResult::isOk(&_assertionStats->assertionResult), bVar1)) {
    OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult);
    if (OVar3 != Warning) {
      return false;
    }
    printer._55_1_ = 0;
  }
  anon_unknown_23::AssertionPrinter::AssertionPrinter
            ((AssertionPrinter *)local_68,(this->super_StreamingReporterBase).stream,_assertionStats
             ,(bool)(printer._55_1_ & 1));
  anon_unknown_23::AssertionPrinter::print((AssertionPrinter *)local_68);
  std::ostream::operator<<
            ((this->super_StreamingReporterBase).stream,std::endl<char,std::char_traits<char>>);
  anon_unknown_23::AssertionPrinter::~AssertionPrinter((AssertionPrinter *)local_68);
  return true;
}

Assistant:

bool CompactReporter::assertionEnded(AssertionStats const &_assertionStats) {
        AssertionResult const &result = _assertionStats.assertionResult;

        bool printInfoMessages = true;

        // Drop out if result was successful and we're not printing those
        if (!m_config->includeSuccessfulResults() && result.isOk()) {
            if (result.getResultType() != ResultWas::Warning)
                return false;
            printInfoMessages = false;
        }

        AssertionPrinter printer(stream, _assertionStats, printInfoMessages);
        printer.print();

        stream << std::endl;
        return true;
    }